

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flood.cpp
# Opt level: O0

void __thiscall
vera::Flood::allocate
          (Flood *this,int _width,int _height,FboType _type,TextureFilter _filter,TextureWrap _wrap,
          bool _autoclear)

{
  int *piVar1;
  ulong uVar2;
  long *plVar3;
  __type_conflict _Var4;
  double dVar5;
  int local_2c;
  int i;
  bool _autoclear_local;
  TextureWrap _wrap_local;
  TextureFilter _filter_local;
  FboType _type_local;
  int _height_local;
  int _width_local;
  Flood *this_local;
  
  _filter_local = _height;
  _type_local = _width;
  __height_local = this;
  piVar1 = std::max<int>((int *)&_type_local,(int *)&_filter_local);
  _Var4 = std::log2<int>(*piVar1);
  dVar5 = log2(2.0);
  dVar5 = ceil(_Var4 / dVar5);
  uVar2 = (ulong)(dVar5 + 1.0);
  this->m_interations = uVar2 | (long)((dVar5 + 1.0) - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    plVar3 = (long *)(&(this->super_PingPong).field_0x18 + (long)local_2c * 0x38);
    (**(code **)(*plVar3 + 0x10))(plVar3,_type_local,_filter_local,_type,_filter,_wrap,_autoclear);
  }
  (*(this->super_PingPong)._vptr_PingPong[4])(0);
  (this->super_PingPong).m_flag = 0;
  (*(this->super_PingPong)._vptr_PingPong[3])();
  return;
}

Assistant:

void Flood::allocate(int _width, int _height, FboType _type, TextureFilter _filter, TextureWrap _wrap, bool _autoclear) {
    // Set number of iterations based on the resolution
    m_interations = ceil(log2(std::max(_width, _height)) / log2(2.0)) + 1;

    // Allocate the FBOs
    for(int i = 0; i < 2; i++)
        m_fbos[i].allocate(_width, _height, _type, _filter, _wrap, _autoclear);

    // Clean the FBOs
    clear();

    // Set everything to 0
    m_flag = 0;
    swap();
}